

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O2

bool __thiscall ON_3dmConstructionPlane::Write(ON_3dmConstructionPlane *this,ON_BinaryArchive *file)

{
  bool bVar1;
  
  bVar1 = ON_BinaryArchive::Write3dmChunkVersion(file,1,1);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WritePlane(file,&this->m_plane);
    if (bVar1) {
      bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_grid_spacing);
      if (bVar1) {
        bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_snap_spacing);
        if (bVar1) {
          bVar1 = ON_BinaryArchive::WriteInt(file,this->m_grid_line_count);
          if (bVar1) {
            bVar1 = ON_BinaryArchive::WriteInt(file,this->m_grid_thick_frequency);
            if (bVar1) {
              bVar1 = ON_BinaryArchive::WriteString(file,&this->m_name);
              if (bVar1) {
                bVar1 = ON_BinaryArchive::WriteBool(file,this->m_bDepthBuffer);
                return bVar1;
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_3dmConstructionPlane::Write( ON_BinaryArchive& file ) const
{
  bool rc = file.Write3dmChunkVersion(1,1);

  if (rc) rc = file.WritePlane(m_plane);
  if (rc) rc = file.WriteDouble(m_grid_spacing);
  if (rc) rc = file.WriteDouble(m_snap_spacing);
  if (rc) rc = file.WriteInt(m_grid_line_count);
  if (rc) rc = file.WriteInt(m_grid_thick_frequency);
  if (rc) rc = file.WriteString(m_name);

  // added for version 1.1 chunks
  if (rc) rc = file.WriteBool(m_bDepthBuffer);

  return rc;
}